

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_cf_create(Curl_cfilter **pcf,Curl_cftype *cft,void *ctx)

{
  Curl_cfilter *pCVar1;
  CURLcode local_2c;
  CURLcode result;
  Curl_cfilter *cf;
  void *ctx_local;
  Curl_cftype *cft_local;
  Curl_cfilter **pcf_local;
  
  local_2c = CURLE_OUT_OF_MEMORY;
  pCVar1 = (Curl_cfilter *)(*Curl_ccalloc)(1,0x28);
  if (pCVar1 != (Curl_cfilter *)0x0) {
    pCVar1->cft = cft;
    pCVar1->ctx = ctx;
    local_2c = CURLE_OK;
  }
  *pcf = pCVar1;
  return local_2c;
}

Assistant:

CURLcode Curl_cf_create(struct Curl_cfilter **pcf,
                        const struct Curl_cftype *cft,
                        void *ctx)
{
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(cft);
  cf = calloc(1, sizeof(*cf));
  if(!cf)
    goto out;

  cf->cft = cft;
  cf->ctx = ctx;
  result = CURLE_OK;
out:
  *pcf = cf;
  return result;
}